

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  cmOSXBundleGenerator *pcVar5;
  MacOSXContentGeneratorType *pMVar6;
  short *__n1;
  cmLocalUnixMakefileGenerator3 *pcVar7;
  _Base_ptr p_Var8;
  cmSourceFile *this_00;
  long *plVar9;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar10;
  undefined8 uVar11;
  undefined1 auVar12 [8];
  bool bVar13;
  int iVar14;
  string *psVar15;
  cmValue cVar16;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_01;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar17;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar18;
  cmFileSet *this_02;
  mapped_type *pmVar19;
  _Rb_tree_node_base *p_Var20;
  iterator iVar21;
  string *psVar22;
  cmMakefileTargetGenerator *pcVar23;
  cmMakefileTargetGenerator *pcVar24;
  pointer ppcVar25;
  __node_base_ptr this_03;
  string *output;
  pointer pbVar26;
  _Base_ptr p_Var27;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *cge;
  string *ispcObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  undefined1 __v [8];
  _Base_ptr __k;
  pointer puVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar31;
  string_view value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_set_map;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredLangs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  undefined8 in_stack_fffffffffffffc10;
  _Manager_type in_stack_fffffffffffffc18;
  cmSourceFile *local_3d0;
  undefined1 local_3c8 [16];
  string local_3b8;
  undefined1 local_398 [16];
  pointer local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [32];
  undefined1 local_348 [8];
  undefined1 local_340 [8];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  _Alloc_hider local_318;
  undefined1 local_310 [16];
  char *local_300;
  _Base_ptr local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  char *local_2e0;
  undefined1 local_1e8 [16];
  pointer local_1d8;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  __node_base_ptr local_1b0;
  undefined1 local_1a8 [32];
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  long local_158;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_150;
  bool local_130;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_128;
  bool local_108;
  _Base_ptr local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_48;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,this);
  cmGeneratorTarget::CheckCxxModuleStatus(pcVar2,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  bVar13 = cmGeneratorTarget::HaveCxx20ModuleSources
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar13) {
    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
    psVar15 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    local_338._8_8_ = (psVar15->_M_dataplus)._M_p;
    local_338._0_8_ = psVar15->_M_string_length;
    local_348 = (undefined1  [8])0x5;
    local_340 = (undefined1  [8])0x753607;
    local_328._0_8_ = (_Rb_tree_node_base *)0x4d;
    local_328._8_8_ =
         "\" target contains C++ module sources which are not supported by the generator";
    views._M_len = 3;
    views._M_array = (iterator)local_348;
    cmCatViews_abi_cxx11_((string *)local_3c8,views);
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_3c8);
    if ((string *)local_3c8._0_8_ != &local_3b8) {
      operator_delete((void *)local_3c8._0_8_,(long)local_3b8._M_dataplus._M_p + 1);
    }
  }
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  local_348 = (undefined1  [8])local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,"ADDITIONAL_MAKE_CLEAN_FILES","");
  cVar16 = cmMakefile::GetProperty(pcVar3,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  pcVar23 = this;
  if (cVar16.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_348,(anon_class_8_1_8991fb9c *)this,
               (string *)((cVar16.Value)->_M_dataplus)._M_p);
    auVar12 = local_340;
    psVar1 = &this->CleanFiles;
    local_3c8._0_8_ = psVar1;
    if (local_348 != local_340) {
      psVar10 = &pcVar23->CleanFiles;
      __v = local_348;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)psVar1,(const_iterator)&(psVar10->_M_t)._M_impl.super__Rb_tree_header,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                   (_Alloc_node *)local_3c8);
        __v = (undefined1  [8])((long)__v + 0x20);
      } while (__v != auVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
  }
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  local_348 = (undefined1  [8])local_338;
  pcVar24 = pcVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"ADDITIONAL_CLEAN_FILES","");
  cVar16 = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  if (cVar16.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8,(anon_class_8_1_8991fb9c *)pcVar23,
               (string *)((cVar16.Value)->_M_dataplus)._M_p);
    psVar15 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)pcVar23->LocalGenerator);
    pcVar23 = pcVar24;
    if ((string *)local_3c8._0_8_ != (string *)CONCAT44(local_3c8._12_4_,local_3c8._8_4_)) {
      psVar22 = (string *)local_3c8._0_8_;
      do {
        cmsys::SystemTools::CollapseFullPath((string *)local_348,psVar22,psVar15);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pcVar24->CleanFiles,(string *)local_348);
        if (local_348 != (undefined1  [8])local_338) {
          operator_delete((void *)local_348,local_338._0_8_ + 1);
        }
        psVar22 = psVar22 + 1;
      } while (psVar22 != (string *)CONCAT44(local_3c8._12_4_,local_3c8._8_4_));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3c8);
    pcVar24 = pcVar23;
  }
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmGeneratorTarget::GetGeneratedISPCObjects(&local_78,pcVar2,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = &pcVar24->CleanFiles;
    p_Var27 = (_Base_ptr)
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)local_348,
                 &(pcVar24->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)p_Var27);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)psVar1,(string *)local_348);
      if (local_348 != (undefined1  [8])local_338) {
        operator_delete((void *)local_348,local_338._0_8_ + 1);
      }
      p_Var27 = p_Var27 + 1;
    } while (p_Var27 !=
             (_Base_ptr)
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar3 = (pcVar24->super_cmCommonTargetGenerator).Makefile;
  local_348 = (undefined1  [8])local_338;
  pcVar23 = pcVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"CLEAN_NO_CUSTOM","");
  cVar16 = cmMakefile::GetProperty(pcVar3,(string *)local_348);
  if (cVar16.Value == (string *)0x0) {
    bVar13 = true;
  }
  else {
    value._M_str = ((cVar16.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar16.Value)->_M_string_length;
    bVar13 = cmValue::IsOff(value);
  }
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (pointer)0x0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetCustomCommands
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_1c8
             ,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  uVar11 = local_1c8._8_8_;
  pcVar24 = pcVar23;
  if (local_1c8._0_8_ != local_1c8._8_8_) {
    ppcVar25 = (pointer)local_1c8._0_8_;
    do {
      local_378._0_8_ = *ppcVar25;
      if ((code)pcVar24->CMP0113New == (code)0x1) {
        local_348 = (undefined1  [8])(pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
        this_01 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                   *)std::
                     map<const_cmGeneratorTarget_*,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>_>_>_>
                     ::operator[](&pcVar24->LocalGenerator->CommandsVisited,(key_type *)local_348);
        pVar31 = std::
                 _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 ::_M_insert_unique<cmSourceFile_const*const&>(this_01,(cmSourceFile **)local_378);
        if (((undefined1  [16])pVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_004fe966;
      }
      else {
LAB_004fe966:
        cc = cmSourceFile::GetCustomCommand((cmSourceFile *)local_378._0_8_);
        GetConfigName_abi_cxx11_(&local_98,pcVar23);
        local_108 = false;
        local_d8 = (undefined1  [16])0x0;
        local_c8 = (undefined1  [16])0x0;
        computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc10;
        computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = local_d8;
        computeInternalDepfile.super__Function_base._M_manager = in_stack_fffffffffffffc18;
        computeInternalDepfile._M_invoker = (_Invoker_type)pcVar24;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)local_348,cc,&local_98,
                   (cmLocalGenerator *)pcVar23->LocalGenerator,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_128,computeInternalDepfile);
        if ((code *)local_c8._0_8_ != (code *)0x0) {
          (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
        }
        if ((local_108 == true) &&
           (local_108 = false,
           local_128._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_128._M_value + 0x10)))
        {
          operator_delete((void *)local_128._M_value._M_dataplus._M_p,local_128._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          (ulong)(local_98.field_2._M_allocated_capacity + 1));
        }
        GenerateCustomRuleFile(pcVar24,(cmCustomCommandGenerator *)local_348);
        if (bVar13 != false) {
          pvVar17 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                              ((cmCustomCommandGenerator *)local_348);
          pbVar4 = (pvVar17->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar26 = (pvVar17->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
              pbVar26 = pbVar26 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)local_3c8,
                       &(pcVar24->LocalGenerator->super_cmLocalCommonGenerator).
                        super_cmLocalGenerator.super_cmOutputConverter,pbVar26);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pcVar23->CleanFiles,(string *)local_3c8);
            if ((string *)local_3c8._0_8_ != &local_3b8) {
              operator_delete((void *)local_3c8._0_8_,(long)local_3b8._M_dataplus._M_p + 1);
            }
          }
          pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                              ((cmCustomCommandGenerator *)local_348);
          pbVar4 = (pvVar17->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar26 = (pvVar17->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
              pbVar26 = pbVar26 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)local_3c8,
                       &(pcVar24->LocalGenerator->super_cmLocalCommonGenerator).
                        super_cmLocalGenerator.super_cmOutputConverter,pbVar26);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pcVar23->CleanFiles,(string *)local_3c8);
            if ((string *)local_3c8._0_8_ != &local_3b8) {
              operator_delete((void *)local_3c8._0_8_,(long)local_3b8._M_dataplus._M_p + 1);
            }
          }
        }
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_348);
      }
      ppcVar25 = ppcVar25 + 1;
    } while (ppcVar25 != (pointer)uVar11);
  }
  pcVar23 = pcVar24;
  if (bVar13 != false) {
    pvVar18 = cmGeneratorTarget::GetPreBuildCommands
                        ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_378,pvVar18);
    pvVar18 = cmGeneratorTarget::GetPreLinkCommands
                        ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_378,
               CONCAT44(local_378._12_4_,local_378._8_4_),
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pvVar18 = cmGeneratorTarget::GetPostBuildCommands
                        ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_378,
               CONCAT44(local_378._12_4_,local_378._8_4_),
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    local_3d0 = (cmSourceFile *)local_378._0_8_;
    if ((cmSourceFile *)local_378._0_8_ !=
        (cmSourceFile *)CONCAT44(local_378._12_4_,local_378._8_4_)) {
      psVar1 = &pcVar24->CleanFiles;
      do {
        GetConfigName_abi_cxx11_((string *)local_b8,pcVar24);
        local_130 = false;
        local_f8 = (undefined1  [16])0x0;
        local_e8 = (undefined1  [16])0x0;
        computeInternalDepfile_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc10;
        computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_object = local_f8;
        computeInternalDepfile_00.super__Function_base._M_manager = in_stack_fffffffffffffc18;
        computeInternalDepfile_00._M_invoker = (_Invoker_type)pcVar23;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)local_348,(cmCustomCommand *)local_3d0,
                   (string *)local_b8,(cmLocalGenerator *)pcVar24->LocalGenerator,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_150,computeInternalDepfile_00);
        pcVar24 = pcVar23;
        if ((code *)local_e8._0_8_ != (code *)0x0) {
          (*(code *)local_e8._0_8_)(local_f8,local_f8,3);
          pcVar24 = pcVar23;
        }
        if ((local_130 == true) &&
           (local_130 = false,
           local_150._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_150._M_value + 0x10)))
        {
          operator_delete((void *)local_150._M_value._M_dataplus._M_p,(ulong)(local_150._16_8_ + 1))
          ;
        }
        if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
        pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)local_348);
        pbVar4 = (pvVar17->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar26 = (pvVar17->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
            pbVar26 = pbVar26 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)local_3c8,
                     &(pcVar24->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                      .super_cmOutputConverter,pbVar26);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)psVar1,(string *)local_3c8);
          if ((string *)local_3c8._0_8_ != &local_3b8) {
            operator_delete((void *)local_3c8._0_8_,(long)local_3b8._M_dataplus._M_p + 1);
          }
        }
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_348);
        local_3d0 = (cmSourceFile *)
                    &(local_3d0->CompileOptions).
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar23 = pcVar24;
      } while (local_3d0 != (cmSourceFile *)CONCAT44(local_378._12_4_,local_378._8_4_));
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_378);
  }
  local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )0x0;
  local_158 = 0;
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar24 = pcVar23;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmGeneratorTarget::GetHeaderSources
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    &local_168,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  pcVar5 = (pcVar23->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pMVar6 = (pcVar23->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar5,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    &local_168,&pMVar6->super_MacOSXContentGeneratorType,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  local_188 = (undefined1  [16])0x0;
  local_178._M_p = (pointer)0x0;
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmGeneratorTarget::GetExtraSources
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_188
             ,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  pcVar5 = (pcVar23->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pMVar6 = (pcVar23->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar5,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_188
             ,&pMVar6->super_MacOSXContentGeneratorType,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  pcVar3 = (pcVar23->super_cmCommonTargetGenerator).Makefile;
  local_348 = (undefined1  [8])local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"CMAKE_PCH_EXTENSION","");
  cVar16 = cmMakefile::GetDefinition(pcVar3,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = (pointer)0x0;
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmGeneratorTarget::GetExternalObjects
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_1e8
             ,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  uVar11 = local_1e8._8_8_;
  if (local_1e8._0_8_ != local_1e8._8_8_) {
    pvVar17 = &pcVar24->ExternalObjects;
    ppcVar25 = (pointer)local_1e8._0_8_;
    do {
      psVar15 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar25);
      local_340 = (undefined1  [8])(psVar15->_M_dataplus)._M_p;
      local_348 = (undefined1  [8])psVar15->_M_string_length;
      if (cVar16.Value == (string *)0x0) {
LAB_004ff01f:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar17,psVar15);
      }
      else {
        __n1 = (short *)(cVar16.Value)->_M_string_length;
        if (((ulong)local_348 < __n1) ||
           (__str._M_str = ((cVar16.Value)->_M_dataplus)._M_p, __str._M_len = (size_t)__n1,
           iVar14 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_348,
                               (long)local_348 - (long)__n1,(size_type)__n1,__str), iVar14 != 0))
        goto LAB_004ff01f;
      }
      ppcVar25 = ppcVar25 + 1;
    } while (ppcVar25 != (pointer)uVar11);
  }
  local_3b8._M_string_length = (size_type)(local_3c8 + 8);
  local_3c8._8_4_ = _S_red;
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8.field_2._8_8_ = 0;
  this_03 = (__node_base_ptr)((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  pcVar23 = pcVar24;
  local_3b8.field_2._M_allocated_capacity = local_3b8._M_string_length;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a8,(cmTarget *)this_03);
  local_100 = (_Base_ptr)local_1a8._8_8_;
  local_1b0 = this_03;
  if (local_1a8._0_8_ != local_1a8._8_8_) {
    p_Var27 = (_Base_ptr)local_1a8._0_8_;
    do {
      this_02 = cmTarget::GetFileSet((cmTarget *)this_03,(string *)p_Var27);
      if (this_02 == (cmFileSet *)0x0) {
        pcVar3 = (pcVar24->super_cmCommonTargetGenerator).Makefile;
        psVar15 = cmTarget::GetName_abi_cxx11_((cmTarget *)this_03);
        local_338._8_8_ = (psVar15->_M_dataplus)._M_p;
        local_338._0_8_ = psVar15->_M_string_length;
        local_348 = (undefined1  [8])0x8;
        local_340 = (undefined1  [8])((long)"\nTarget \"" + 1);
        local_328._0_8_ = (_Rb_tree_node_base *)0x1f;
        local_328._8_8_ = "\" is tracked to have file set \"";
        local_310._0_8_ = *(undefined8 *)p_Var27;
        local_318._M_p = (pointer)p_Var27->_M_parent;
        local_310._8_8_ = 0x18;
        local_300 = "\", but it was not found.";
        views_00._M_len = 5;
        views_00._M_array = (iterator)local_348;
        cmCatViews_abi_cxx11_((string *)local_378,views_00);
        cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,(string *)local_378);
        if ((cmSourceFile *)local_378._0_8_ != (cmSourceFile *)local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._0_8_ + 1));
        }
      }
      else {
        cmFileSet::CompileFileEntries
                  ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)local_398,this_02);
        cmFileSet::CompileDirectoryEntries(&local_48,this_02);
        pcVar7 = pcVar24->LocalGenerator;
        GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
        cmFileSet::EvaluateDirectoryEntries
                  (&local_60,this_02,&local_48,(cmLocalGenerator *)pcVar7,(string *)local_348,
                   (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmGeneratorExpressionDAGChecker *)0x0);
        pcVar24 = pcVar23;
        if (local_348 != (undefined1  [8])local_338) {
          operator_delete((void *)local_348,local_338._0_8_ + 1);
          pcVar24 = pcVar23;
        }
        local_340 = (undefined1  [8])((ulong)local_340 & 0xffffffff00000000);
        local_338._0_8_ = 0;
        local_338._8_8_ = local_340;
        local_328._8_8_ = (char *)0x0;
        uVar11 = local_398._8_8_;
        cge = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_398._0_8_;
        pcVar23 = pcVar24;
        local_328._0_8_ = local_338._8_8_;
        if (local_398._0_8_ != local_398._8_8_) {
          do {
            pcVar7 = pcVar23->LocalGenerator;
            pcVar24 = pcVar23;
            GetConfigName_abi_cxx11_((string *)local_378,pcVar23);
            cmFileSet::EvaluateFileEntry
                      (this_02,&local_60,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)local_348,cge,(cmLocalGenerator *)pcVar7,(string *)local_378,
                       (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget,
                       (cmGeneratorExpressionDAGChecker *)0x0);
            if ((cmSourceFile *)local_378._0_8_ != (cmSourceFile *)local_368) {
              operator_delete((void *)local_378._0_8_,(ulong)(local_368._0_8_ + 1));
            }
            cge = cge + 1;
            pcVar23 = pcVar24;
          } while (cge != (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)uVar11);
          p_Var20 = (_Rb_tree_node_base *)local_338._8_8_;
          if ((_Rb_tree_node_base *)local_338._8_8_ != (_Rb_tree_node_base *)local_340) {
            do {
              p_Var8 = p_Var20[2]._M_parent;
              for (__k = *(_Base_ptr *)(p_Var20 + 2); __k != p_Var8; __k = __k + 1) {
                pmVar19 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)local_3c8,(key_type *)__k);
                std::__cxx11::string::_M_assign((string *)pmVar19);
              }
              p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
            } while (p_Var20 != (_Rb_tree_node_base *)local_340);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_348);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&local_48);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   *)local_398);
        this_03 = local_1b0;
        pcVar23 = pcVar24;
      }
      p_Var27 = p_Var27 + 1;
    } while (p_Var27 != local_100);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a8);
  local_398 = (undefined1  [16])0x0;
  local_388 = (pointer)0x0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetObjectSources
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398
             ,(string *)local_348);
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,local_338._0_8_ + 1);
  }
  local_368._8_8_ = local_378 + 8;
  local_378._8_4_ = _S_red;
  local_368._0_8_ = (pointer)0x0;
  local_368._24_8_ = 0;
  local_368._16_8_ = local_368._8_8_;
  bVar13 = cmCommonTargetGenerator::HaveRequiredLanguages
                     (&pcVar24->super_cmCommonTargetGenerator,
                      (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_398,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_378);
  puVar28 = (pointer)local_398._0_8_;
  if ((bVar13) && (uVar11 = local_398._8_8_, local_398._0_8_ != local_398._8_8_)) {
    do {
      WriteObjectRuleFiles
                (pcVar23,(cmSourceFile *)
                         (puVar28->_M_t).
                         super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                         .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl
                );
      puVar28 = puVar28 + 1;
    } while (puVar28 != (pointer)uVar11);
    puVar28 = (pointer)local_398._0_8_;
  }
  uVar11 = local_398._8_8_;
  do {
    if (puVar28 == (pointer)uVar11) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_378);
      if ((pointer)local_398._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_398._0_8_,(long)local_388 - local_398._0_8_);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_3c8);
      if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1e8._0_8_,(long)local_1d8 - local_1e8._0_8_);
      }
      if ((_Base_ptr)local_188._0_8_ != (_Base_ptr)0x0) {
        operator_delete((void *)local_188._0_8_,(long)local_178._M_p - local_188._0_8_);
      }
      if ((void *)local_168._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_168._M_allocated_capacity,local_158 - local_168._0_8_);
      }
      if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      return;
    }
    this_00 = (cmSourceFile *)
              (puVar28->_M_t).
              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
    psVar15 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
    iVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_3c8,psVar15);
    if (iVar21._M_node != (_Base_ptr)(local_3c8 + 8)) {
      plVar9 = *(long **)(iVar21._M_node + 2);
      if (iVar21._M_node[2]._M_parent == (_Base_ptr)0x17) {
        auVar29[0] = -((char)*plVar9 == 'C');
        auVar29[1] = -(*(char *)((long)plVar9 + 1) == 'X');
        auVar29[2] = -(*(char *)((long)plVar9 + 2) == 'X');
        auVar29[3] = -(*(char *)((long)plVar9 + 3) == '_');
        auVar29[4] = -(*(char *)((long)plVar9 + 4) == 'M');
        auVar29[5] = -(*(char *)((long)plVar9 + 5) == 'O');
        auVar29[6] = -(*(char *)((long)plVar9 + 6) == 'D');
        auVar29[7] = -(*(char *)((long)plVar9 + 7) == 'U');
        auVar29[8] = -((char)plVar9[1] == 'L');
        auVar29[9] = -(*(char *)((long)plVar9 + 9) == 'E');
        auVar29[10] = -(*(char *)((long)plVar9 + 10) == '_');
        auVar29[0xb] = -(*(char *)((long)plVar9 + 0xb) == 'H');
        auVar29[0xc] = -(*(char *)((long)plVar9 + 0xc) == 'E');
        auVar29[0xd] = -(*(char *)((long)plVar9 + 0xd) == 'A');
        auVar29[0xe] = -(*(char *)((long)plVar9 + 0xe) == 'D');
        auVar29[0xf] = -(*(char *)((long)plVar9 + 0xf) == 'E');
        auVar30[0] = -(*(char *)((long)plVar9 + 7) == 'U');
        auVar30[1] = -((char)plVar9[1] == 'L');
        auVar30[2] = -(*(char *)((long)plVar9 + 9) == 'E');
        auVar30[3] = -(*(char *)((long)plVar9 + 10) == '_');
        auVar30[4] = -(*(char *)((long)plVar9 + 0xb) == 'H');
        auVar30[5] = -(*(char *)((long)plVar9 + 0xc) == 'E');
        auVar30[6] = -(*(char *)((long)plVar9 + 0xd) == 'A');
        auVar30[7] = -(*(char *)((long)plVar9 + 0xe) == 'D');
        auVar30[8] = -(*(char *)((long)plVar9 + 0xf) == 'E');
        auVar30[9] = -((char)plVar9[2] == 'R');
        auVar30[10] = -(*(char *)((long)plVar9 + 0x11) == '_');
        auVar30[0xb] = -(*(char *)((long)plVar9 + 0x12) == 'U');
        auVar30[0xc] = -(*(char *)((long)plVar9 + 0x13) == 'N');
        auVar30[0xd] = -(*(char *)((long)plVar9 + 0x14) == 'I');
        auVar30[0xe] = -(*(char *)((long)plVar9 + 0x15) == 'T');
        auVar30[0xf] = -(*(char *)((long)plVar9 + 0x16) == 'S');
        auVar30 = auVar30 & auVar29;
        if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) goto LAB_004ff51b;
      }
      else if ((iVar21._M_node[2]._M_parent == (_Base_ptr)0xb) &&
              (*(long *)((long)plVar9 + 3) == 0x53454c55444f4d5f && *plVar9 == 0x55444f4d5f585843))
      {
LAB_004ff51b:
        cmSourceFile::GetLanguage_abi_cxx11_((string *)local_348,this_00);
        bVar13 = true;
        if (local_340 == (undefined1  [8])0x3) {
          bVar13 = *(char *)((long)local_348 + 2) != 'X' || *(short *)local_348 != 0x5843;
        }
        if (local_348 != (undefined1  [8])local_338) {
          operator_delete((void *)local_348,local_338._0_8_ + 1);
        }
        if (bVar13) {
          pcVar3 = (pcVar23->super_cmCommonTargetGenerator).Makefile;
          psVar22 = cmTarget::GetName_abi_cxx11_((cmTarget *)local_1b0);
          local_338._8_8_ = (psVar22->_M_dataplus)._M_p;
          local_338._0_8_ = psVar22->_M_string_length;
          local_348 = (undefined1  [8])0x8;
          local_340 = (undefined1  [8])((long)"\nTarget \"" + 1);
          local_328._0_8_ = (_Rb_tree_node_base *)0x18;
          local_328._8_8_ = "\" contains the source\n  ";
          local_310._0_8_ = (psVar15->_M_dataplus)._M_p;
          local_318._M_p = (pointer)psVar15->_M_string_length;
          local_310._8_8_ = 0x18;
          local_300 = "\nin a file set of type \"";
          local_2f0._M_allocated_capacity = *(undefined8 *)(iVar21._M_node + 2);
          local_2f8 = iVar21._M_node[2]._M_parent;
          local_2f0._8_8_ = (_Base_ptr)0x35;
          local_2e0 = "\" but the source is not classified as a \"CXX\" source.";
          views_01._M_len = 7;
          views_01._M_array = (iterator)local_348;
          cmCatViews_abi_cxx11_((string *)local_1a8,views_01);
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1a8);
          if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
          }
        }
      }
    }
    puVar28 = puVar28 + 1;
  } while( true );
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  this->GeneratorTarget->CheckCxxModuleStatus(this->GetConfigName());

  if (this->GeneratorTarget->HaveCxx20ModuleSources()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("The \"", this->GeneratorTarget->GetName(),
               "\" target contains C++ module sources which are not supported "
               "by the generator"));
  }

  // -- Write the custom commands for this target

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles =
    [this](const std::string& prop_value) -> std::vector<std::string> {
    std::vector<std::string> files;
    cmExpandList(cmGeneratorExpression::Evaluate(
                   prop_value, this->LocalGenerator, this->GetConfigName(),
                   this->GeneratorTarget),
                 files);
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(*prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (cmValue prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(*prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // Look for ISPC extra object files generated by this target
  auto ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& ispcObj : ispcAdditionalObjs) {
    this->CleanFiles.insert(
      this->LocalGenerator->MaybeRelativeToCurBinDir(ispcObj));
  }

  // add custom commands to the clean rules?
  bool clean = cmIsOff(this->Makefile->GetProperty("CLEAN_NO_CUSTOM"));

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (this->CMP0113New &&
        !this->LocalGenerator->GetCommandsVisited(this->GeneratorTarget)
           .insert(sf)
           .second) {
      continue;
    }
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(),
                                 this->GetConfigName(), this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPreLinkCommands());
    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      cmCustomCommandGenerator beg(be, this->GetConfigName(),
                                   this->LocalGenerator);
      const std::vector<std::string>& byproducts = beg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources,
                                          this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects,
                                            this->GetConfigName());
  for (cmSourceFile const* sf : externalObjects) {
    auto const& objectFileName = sf->GetFullPath();
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      this->ExternalObjects.push_back(objectFileName);
    }
  }

  std::map<std::string, std::string> file_set_map;

  auto const* tgt = this->GeneratorTarget->Target;
  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, this->GetConfigName(),
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        file_set_map[filename] = file_set->GetType();
      }
    }
  }

  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources,
                                          this->GetConfigName());

  // validate that all languages requested are enabled.
  std::set<std::string> requiredLangs;
  if (this->HaveRequiredLanguages(objectSources, requiredLangs)) {
    for (cmSourceFile const* sf : objectSources) {
      // Generate this object file's rule file.
      this->WriteObjectRuleFiles(*sf);
    }
  }

  for (cmSourceFile const* sf : objectSources) {
    auto const& path = sf->GetFullPath();
    auto const it = file_set_map.find(path);
    if (it != file_set_map.end()) {
      auto const& file_set_type = it->second;
      if (file_set_type == "CXX_MODULES"_s ||
          file_set_type == "CXX_MODULE_HEADER_UNITS"_s) {
        if (sf->GetLanguage() != "CXX"_s) {
          this->Makefile->IssueMessage(
            MessageType::FATAL_ERROR,
            cmStrCat(
              "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
              "\nin a file set of type \"", file_set_type,
              R"(" but the source is not classified as a "CXX" source.)"));
        }
      }
    }
  }
}